

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

void amrex::VisMF::AsyncWriteDoit
               (FabArray<amrex::FArrayBox> *mf,string *mf_name,bool is_rvalue,bool valid_cells_only)

{
  How HVar1;
  int iVar2;
  uint n;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  NumComps ncomp;
  element_type *peVar9;
  BaseFab<double> *this;
  pointer pcVar10;
  Box bx;
  pointer plVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  int iVar16;
  Arena *pAVar17;
  int *piVar18;
  long lVar19;
  BaseFab<double> *pBVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  FABio_binary *this_02;
  RealDescriptor *this_03;
  undefined4 extraout_var;
  _func_void *p_Var21;
  undefined7 in_register_00000009;
  _func_int **pp_Var22;
  pointer ppFVar23;
  void *__child_stack;
  double dVar24;
  FabArray<amrex::FArrayBox> *src;
  How *__args_1;
  ulong uVar25;
  double *pdVar26;
  uint comp;
  pointer this_04;
  pair<double,_double> pVar27;
  shared_ptr<amrex::VisMF::Header> hdr;
  Vector<long,_std::allocator<long>_> localdata;
  MFIter mfi;
  stringstream hss;
  shared_ptr<amrex::FABio> fabio;
  int local_32c;
  Header *local_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  vector<long,_std::allocator<long>_> local_2d0;
  _Any_data local_2b8;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  int local_298 [2];
  int local_290;
  long *local_280;
  long *local_278;
  ulong local_250;
  string *local_248;
  FABio *local_240;
  RealDescriptor *local_238;
  long local_230;
  double local_228;
  Box local_21c;
  undefined1 local_200 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1f0;
  int local_1e8;
  uint uStack_1e4;
  int local_1e0 [2];
  element_type *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *local_1b8;
  Vector<int,_std::allocator<int>_> *local_1b0;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  FABio_binary *local_188;
  Arena *apAStack_180 [33];
  BaseFab<double> local_78;
  
  HVar1 = *(How *)(ParallelContext::frames + 0xc);
  iVar2 = *(int *)(ParallelContext::frames + 0x10);
  local_238 = FPC::NativeRealDescriptor();
  __args_1 = (How *)local_200;
  local_200._0_4_ = NFiles;
  local_2b8._0_4_ = 1;
  local_21c.smallend.vect[0] = local_21c.smallend.vect[0] & 0xffffff00;
  local_2e0 = (Header *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<amrex::VisMF::Header,std::allocator<amrex::VisMF::Header>,amrex::FabArray<amrex::FArrayBox>const&,amrex::VisMF::How,amrex::VisMF::Header::Version,bool>
            (&local_2d8,&local_2e0,(allocator<amrex::VisMF::Header> *)&local_78,mf,__args_1,
             (Version *)local_2b8._M_pod_data,(bool *)&local_21c);
  if ((int)CONCAT71(in_register_00000009,valid_cells_only) != 0) {
    (local_2e0->m_ngrow).vect[0] = 0;
    (local_2e0->m_ngrow).vect[1] = 0;
    (local_2e0->m_ngrow).vect[2] = 0;
  }
  peVar9 = (mf->super_FabArrayBase).boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar25 = (long)(peVar9->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           *(long *)&(peVar9->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data;
  n = (mf->super_FabArrayBase).n_comp;
  std::vector<long,_std::allocator<long>_>::vector
            (&local_2d0,
             (long)(int)((ulong)((long)(mf->super_FabArrayBase).indexArray.
                                       super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(mf->super_FabArrayBase).indexArray.
                                      super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2) *
             ((long)(int)n * 2 + 1) + 1,(allocator_type *)local_200);
  pAVar17 = DataAllocator::arena(&mf->m_dallocator);
  pp_Var22 = pAVar17->_vptr_Arena;
  iVar15 = (*pp_Var22[7])(pAVar17);
  if ((char)iVar15 == '\0') {
    pAVar17 = DataAllocator::arena(&mf->m_dallocator);
    pp_Var22 = pAVar17->_vptr_Arena;
    (*pp_Var22[8])(pAVar17);
  }
  plVar11 = local_2d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar15 = (int)pp_Var22;
  if (valid_cells_only) {
    iVar15 = (int)CONCAT71((int7)((ulong)pp_Var22 >> 8),
                           (mf->super_FabArrayBase).n_grow.vect[2] != 0 ||
                           *(long *)(mf->super_FabArrayBase).n_grow.vect != 0);
    local_32c = iVar15;
  }
  else {
    local_32c = 0;
  }
  local_250 = uVar25;
  local_248 = mf_name;
  if ((long)local_2d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_2d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start < 9) {
    dVar24 = 0.0;
  }
  else {
    local_240 = FArrayBox::getFABio();
    MFIter::MFIter((MFIter *)&local_2b8,&mf->super_FabArrayBase,'\0');
    if (local_298[0] < local_290) {
      pdVar26 = (double *)(plVar11 + 1);
      dVar24 = 0.0;
      do {
        *pdVar26 = dVar24;
        piVar18 = local_298;
        if (local_278 != (long *)0x0) {
          piVar18 = (int *)((long)local_298[0] * 4 + *local_278);
        }
        this = &(mf->m_fabs_v).
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar18]->super_BaseFab<double>;
        BATransformer::operator()
                  (&local_21c,(BATransformer *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) + 8),
                   (Box *)((long)*(int *)(*local_280 + (long)local_298[0] * 4) * 0x1c +
                          **(long **)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) + 0x50)));
        std::__cxx11::stringstream::stringstream((stringstream *)local_200);
        __args_1 = (How *)0x0;
        FArrayBox::FArrayBox((FArrayBox *)&local_78,&local_21c,n,false,false,(Arena *)0x0);
        pBVar20 = this;
        if ((char)local_32c != '\0') {
          pBVar20 = &local_78;
        }
        (*local_240->_vptr_FABio[6])(local_240,&p_Stack_1f0,pBVar20,(ulong)n);
        lVar19 = std::ostream::tellp();
        pBVar20 = this;
        if ((char)local_32c != '\0') {
          pBVar20 = &local_78;
        }
        iVar15 = pBVar20->nvar;
        iVar3 = (pBVar20->domain).bigend.vect[0];
        iVar4 = (pBVar20->domain).smallend.vect[0];
        iVar5 = (pBVar20->domain).smallend.vect[1];
        iVar6 = (pBVar20->domain).bigend.vect[1];
        iVar7 = (pBVar20->domain).bigend.vect[2];
        iVar8 = (pBVar20->domain).smallend.vect[2];
        iVar16 = RealDescriptor::numBytes(local_238);
        pdVar26 = pdVar26 + 1;
        local_230 = lVar19;
        local_228 = dVar24;
        if (0 < (int)n) {
          comp = 0;
          do {
            pVar27 = BaseFab<double>::minmax<(amrex::RunOn)1>(this,&local_21c,comp);
            *pdVar26 = pVar27.first;
            pdVar26[1] = pVar27.second;
            comp = comp + 1;
            pdVar26 = pdVar26 + 2;
          } while (n != comp);
        }
        lVar19 = (long)((iVar6 - iVar5) + 1);
        dVar24 = (double)((long)iVar16 *
                          ((iVar7 - iVar8) + 1) * lVar19 *
                          (long)((iVar3 - iVar4) + 1) * (long)iVar15 + local_230 + (long)local_228);
        local_78._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
        BaseFab<double>::clear(&local_78);
        iVar15 = (int)lVar19;
        std::__cxx11::stringstream::~stringstream((stringstream *)local_200);
        std::ios_base::~ios_base((ios_base *)apAStack_180);
        MFIter::operator++((MFIter *)&local_2b8);
      } while (local_298[0] < local_290);
    }
    else {
      dVar24 = 0.0;
    }
    MFIter::~MFIter((MFIter *)&local_2b8);
  }
  *local_2d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
   _M_start = (long)dVar24;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0074f8f0;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (iVar2 == 1) {
    std::vector<long,_std::allocator<long>_>::_M_move_assign
              ((vector<long,_std::allocator<long>_> *)(this_00 + 1),&local_2d0);
  }
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0074f940;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  src = mf;
  MFIter::MFIter((MFIter *)local_200,&mf->super_FabArrayBase,'\0');
  this_04 = (pointer)(this_01 + 1);
  if (local_1e0[0] < (int)local_1d8) {
    do {
      if ((char)local_32c == '\0') {
        FabArrayBase::fabbox
                  ((Box *)&local_2b8,(FabArrayBase *)local_200._8_8_,
                   (((Vector<int,_std::allocator<int>_> *)local_1c8)->
                   super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_1e0[0]]);
      }
      else {
        BATransformer::operator()
                  ((Box *)&local_2b8,(BATransformer *)(local_200._8_8_ + 8),
                   (Box *)((long)(((Vector<int,_std::allocator<int>_> *)local_1c8)->
                                 super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_1e0[0]] * 0x1c +
                          *(long *)&(((((BoxArray *)(local_200._8_8_ + 8))->m_ref).
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
      }
      if (is_rvalue && (char)local_32c == '\0') {
        piVar18 = local_1e0;
        if (uStack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          piVar18 = (((Vector<int,_std::allocator<int>_> *)uStack_1c0)->
                    super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_1e0[0];
        }
        ppFVar23 = (mf->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        src = (FabArray<amrex::FArrayBox> *)ppFVar23[*piVar18];
        std::vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>::
        emplace_back<amrex::FArrayBox>
                  ((vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_> *)this_04,
                   (FArrayBox *)src);
        iVar15 = (int)ppFVar23;
      }
      else {
        local_21c.smallend.vect[0] = (mf->super_FabArrayBase).n_comp;
        local_78._vptr_BaseFab = (_func_int **)The_Cpu_Arena();
        std::vector<amrex::FArrayBox,std::allocator<amrex::FArrayBox>>::
        emplace_back<amrex::Box&,int,amrex::Arena*>
                  ((vector<amrex::FArrayBox,std::allocator<amrex::FArrayBox>> *)this_04,
                   (Box *)&local_2b8,(int *)&local_21c,(Arena **)&local_78);
        piVar18 = local_1e0;
        if (uStack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          piVar18 = (((Vector<int,_std::allocator<int>_> *)uStack_1c0)->
                    super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_1e0[0];
        }
        src = (FabArray<amrex::FArrayBox> *)
              (mf->m_fabs_v).
              super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar18];
        ncomp.n = *(int *)(*(long *)&this_01[1]._M_use_count + -0x14);
        __args_1 = (How *)(ulong)(uint)ncomp.n;
        bx.btype.itype = uStack_2a0;
        bx.bigend.vect[2] = uStack_2a4;
        iVar15 = 0;
        bx.smallend.vect[2] = local_2b8._8_4_;
        bx.smallend.vect[0] = local_2b8._0_4_;
        bx.smallend.vect[1] = local_2b8._4_4_;
        bx.bigend.vect[0] = local_2b8._12_4_;
        bx.bigend.vect[1] = local_2a8;
        BaseFab<double>::copy<(amrex::RunOn)1>
                  ((BaseFab<double> *)(*(long *)&this_01[1]._M_use_count + -0x48),
                   (BaseFab<double> *)src,bx,(SrcComp)0x0,(DestComp)0x0,ncomp);
      }
      MFIter::operator++((MFIter *)local_200);
    } while (local_1e0[0] < (int)local_1d8);
  }
  MFIter::~MFIter((MFIter *)local_200);
  this_02 = (FABio_binary *)operator_new(0x10);
  this_03 = FPC::NativeRealDescriptor();
  iVar15 = RealDescriptor::clone(this_03,(__fn *)src,__child_stack,iVar15,__args_1);
  FABio_binary::FABio_binary(this_02,(RealDescriptor *)CONCAT44(extraout_var,iVar15));
  local_78._vptr_BaseFab = (_func_int **)this_02;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<amrex::FABio_binary*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.super_DataAllocator,this_02);
  local_200._4_4_ = iVar2 + -1;
  local_1e8 = (int)(local_250 >> 2) * -0x49249249;
  local_200._8_8_ = local_2e0;
  p_Stack_1f0 = local_2d8._M_pi;
  if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d8._M_pi)->_M_use_count = (local_2d8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d8._M_pi)->_M_use_count = (local_2d8._M_pi)->_M_use_count + 1;
    }
  }
  local_1d8 = (mf->super_FabArrayBase).distributionMap.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1d0 = (mf->super_FabArrayBase).distributionMap.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
    }
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  pcVar10 = (local_248->_M_dataplus)._M_p;
  local_200._0_4_ = HVar1;
  uStack_1e4 = n;
  local_1e0[0] = iVar2;
  local_1c8 = this_00 + 1;
  uStack_1c0 = this_00;
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar10,pcVar10 + local_248->_M_string_length);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  local_188 = (FABio_binary *)local_78._vptr_BaseFab;
  apAStack_180[0] = local_78.super_DataAllocator.m_arena;
  if (local_78.super_DataAllocator.m_arena != (Arena *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((local_78.super_DataAllocator.m_arena)->arena_info).release_threshold =
           (int)((local_78.super_DataAllocator.m_arena)->arena_info).release_threshold + 1;
      UNLOCK();
    }
    else {
      *(int *)&((local_78.super_DataAllocator.m_arena)->arena_info).release_threshold =
           (int)((local_78.super_DataAllocator.m_arena)->arena_info).release_threshold + 1;
    }
  }
  local_2a8 = 0;
  uStack_2a4 = 0;
  uStack_2a0 = 0;
  uStack_29c = 0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_4_ = 0;
  local_2b8._12_4_ = 0;
  local_1a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = this_04;
  p_Stack_190 = this_01;
  p_Var21 = (_func_void *)operator_new(0x88);
  p_Var12 = p_Stack_1f0;
  *(ulong *)p_Var21 = CONCAT44(local_200._4_4_,local_200._0_4_);
  *(undefined8 *)(p_Var21 + 0x10) = 0;
  p_Stack_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)(p_Var21 + 8) = local_200._8_8_;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var21 + 0x10) = p_Var12;
  local_200._8_8_ = (FabArrayBase *)0x0;
  *(int *)(p_Var21 + 0x20) = local_1e0[0];
  *(ulong *)(p_Var21 + 0x18) = CONCAT44(uStack_1e4,local_1e8);
  *(element_type **)(p_Var21 + 0x28) = local_1d8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var21 + 0x30) = local_1d0;
  if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
    }
  }
  *(undefined8 *)(p_Var21 + 0x40) = 0;
  uVar13 = (undefined4)uStack_1c0;
  uVar14 = uStack_1c0._4_4_;
  uStack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)(p_Var21 + 0x38) = (undefined4)local_1c8;
  *(undefined4 *)(p_Var21 + 0x3c) = local_1c8._4_4_;
  *(undefined4 *)(p_Var21 + 0x40) = uVar13;
  *(undefined4 *)(p_Var21 + 0x44) = uVar14;
  local_1c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_func_void **)(p_Var21 + 0x48) = p_Var21 + 0x58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var21 + 0x48),local_1b8,
             (long)&(local_1b0->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + (long)local_1b8);
  pAVar17 = apAStack_180[0];
  p_Var12 = p_Stack_190;
  *(undefined8 *)(p_Var21 + 0x70) = 0;
  p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(pointer *)(p_Var21 + 0x68) =
       local_1a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var21 + 0x70) = p_Var12;
  local_1a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)(p_Var21 + 0x80) = 0;
  apAStack_180[0] = (Arena *)0x0;
  *(FABio_binary **)(p_Var21 + 0x78) = local_188;
  *(Arena **)(p_Var21 + 0x80) = pAVar17;
  local_188 = (FABio_binary *)0x0;
  uStack_2a0 = 0x4701f6;
  uStack_29c = 0;
  local_2a8 = 0x470a2e;
  uStack_2a4 = 0;
  local_2b8._M_unused._0_8_ = (undefined8)p_Var21;
  AsyncOut::Submit((function<void_()> *)&local_2b8);
  if ((code *)CONCAT44(uStack_2a4,local_2a8) != (code *)0x0) {
    (*(code *)CONCAT44(uStack_2a4,local_2a8))(&local_2b8,&local_2b8,3);
  }
  if (apAStack_180[0] != (Arena *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apAStack_180[0]);
  }
  if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,
                    (ulong)((long)&(((vector<int,_std::allocator<int>_> *)
                                    &(local_1a8.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->smallend)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + 1));
  }
  if (uStack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_1c0);
  }
  if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if (local_78.super_DataAllocator.m_arena != (Arena *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.super_DataAllocator.m_arena)
    ;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  if ((double *)
      local_2d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_2d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
  }
  return;
}

Assistant:

void
VisMF::AsyncWriteDoit (const FabArray<FArrayBox>& mf, const std::string& mf_name,
                       bool is_rvalue, bool valid_cells_only)
{
    BL_PROFILE("VisMF::AsyncWrite()");

    AMREX_ASSERT(mf_name[mf_name.length() - 1] != '/');
    static_assert(sizeof(int64_t) == sizeof(Real)*2 || sizeof(int64_t) == sizeof(Real),
                  "AsyncWrite: unsupported Real size");

    const DistributionMapping& dm = mf.DistributionMap();

    const int myproc = ParallelDescriptor::MyProc();
    const int nprocs = ParallelDescriptor::NProcs();
    const int io_proc = nprocs - 1;

    RealDescriptor const& whichRD = FPC::NativeRealDescriptor();

    auto hdr = std::make_shared<VisMF::Header>(mf, VisMF::NFiles, VisMF::Header::Version_v1, false);
    if (valid_cells_only) hdr->m_ngrow = IntVect(0);

    constexpr int sizeof_int64_over_real = sizeof(int64_t) / sizeof(Real);
    const int n_local_fabs = mf.local_size();
    const int n_global_fabs = mf.size();
    const int ncomp = mf.nComp();
    const Long n_fab_reals = 2*ncomp;
    const Long n_fab_int64 = 1;
    const Long n_fab_nums = (n_fab_reals/sizeof_int64_over_real) + n_fab_int64;
    const Long n_local_nums = n_fab_nums * n_local_fabs + 1;
    Vector<int64_t> localdata(n_local_nums);

    bool data_on_device = mf.arena()->isManaged() || mf.arena()->isDevice();
    bool run_on_device = data_on_device && Gpu::inLaunchRegion();

    bool strip_ghost = valid_cells_only && mf.nGrowVect() != 0;

    int64_t total_bytes = 0;
    if (localdata.size() > 1) {
        char* pld = (char*)(&(localdata[1]));
        const FABio& fio = FArrayBox::getFABio();
        for (MFIter mfi(mf); mfi.isValid(); ++mfi)
        {
            std::memcpy(pld, &total_bytes, sizeof(int64_t));
            pld += sizeof(int64_t);

            const FArrayBox& fab = mf[mfi];
            const Box& bx = mfi.validbox();

            std::stringstream hss;
            FArrayBox valid_fab(bx, ncomp, false);
            FArrayBox const& header_fab = (strip_ghost) ? valid_fab : fab;
            fio.write_header(hss, header_fab, ncomp);
            total_bytes += static_cast<std::streamoff>(hss.tellp());
            total_bytes += header_fab.size() * whichRD.numBytes();

            // compute min and max
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                auto mm = (run_on_device) ? fab.minmax<RunOn::Device>(bx,icomp)
                                          : fab.minmax<RunOn::Host  >(bx,icomp);
                std::memcpy(pld, &(mm.first), sizeof(Real));
                pld += sizeof(Real);
                std::memcpy(pld, &(mm.second), sizeof(Real));
                pld += sizeof(Real);
            }
        }
    }
    localdata[0] = total_bytes;

    auto globaldata = std::make_shared<Vector<int64_t> >();
    if (nprocs == 1) {
        *globaldata = std::move(localdata);
    }
#ifdef BL_USE_MPI
    else {
        const Long n_global_nums = n_fab_nums * n_global_fabs + nprocs;
        Vector<int> rcnt, rdsp;
        if (myproc == io_proc) {
            globaldata->resize(n_global_nums);
            rcnt.resize(nprocs,1);
            rdsp.resize(nprocs,0);
            for (int k = 0; k < n_global_fabs; ++k) {
                int rank = dm[k];
                rcnt[rank] += n_fab_nums;
            }
            std::partial_sum(rcnt.begin(), rcnt.end()-1, rdsp.begin()+1);
        } else {
            globaldata->resize(1,0);
            rcnt.resize(1,0);
            rdsp.resize(1,0);
        }
        BL_MPI_REQUIRE(MPI_Gatherv(localdata.data(), localdata.size(), MPI_INT64_T,
                                   globaldata->data(), rcnt.data(), rdsp.data(), MPI_INT64_T,
                                   io_proc, ParallelDescriptor::Communicator()));
    }
#endif

    auto myfabs = std::make_shared<Vector<FArrayBox> >();
    for (MFIter mfi(mf); mfi.isValid(); ++mfi) {
        Box bx = strip_ghost ? mfi.validbox() : mfi.fabbox();
#ifdef AMREX_USE_GPU
        if (data_on_device) {
            myfabs->emplace_back(bx, mf.nComp(), The_Pinned_Arena());
            auto& new_fab = myfabs->back();
            if (strip_ghost) {
                new_fab.copy<RunOn::Device>(mf[mfi], bx);
            } else {
                Gpu::dtoh_memcpy_async(new_fab.dataPtr(), mf[mfi].dataPtr(), new_fab.size()*sizeof(Real));
            }
        } else
#endif
        {
            if (is_rvalue && ! strip_ghost) {
                myfabs->emplace_back(std::move(const_cast<FArrayBox&>(mf[mfi])));
            } else {
                myfabs->emplace_back(bx, mf.nComp(), The_Cpu_Arena());
                auto& new_fab = myfabs->back();
                new_fab.copy<RunOn::Host>(mf[mfi], bx);
            }
        }
    }

    std::shared_ptr<FABio> fabio(new FABio_binary(FPC::NativeRealDescriptor().clone()));

    AsyncOut::Submit([=] ()
    {
        if (myproc == io_proc)
        {
            hdr->m_fod.resize(n_global_fabs);
            hdr->m_min.resize(n_global_fabs);
            hdr->m_max.resize(n_global_fabs);
            hdr->m_famin.clear();
            hdr->m_famax.clear();
            hdr->m_famin.resize(ncomp,std::numeric_limits<Real>::max());
            hdr->m_famax.resize(ncomp,std::numeric_limits<Real>::lowest());

            Vector<int64_t> nbytes_on_rank(nprocs,-1L);
            Vector<Vector<int> > gidx(nprocs);
            for (int k = 0; k < n_global_fabs; ++k) {
                int rank = dm[k];
                gidx[rank].push_back(k);
            }

            auto pgd = (char*)(globaldata->data());
            {
                int rank = 0, lidx = 0;
                for (int j = 0; j < n_global_fabs; ++j)
                {
                    int k = -1;
                    do {
                        if (lidx < gidx[rank].size()) {
                            k = gidx[rank][lidx];
                            ++lidx;
                        } else {
                            ++rank;
                            lidx = 0;
                        }
                    } while (k < 0);

                    hdr->m_min[k].resize(ncomp);
                    hdr->m_max[k].resize(ncomp);

                    if (nbytes_on_rank[rank] < 0) { // First time for this rank
                        std::memcpy(&(nbytes_on_rank[rank]), pgd, sizeof(int64_t));
                        pgd += sizeof(int64_t);
                    }

                    int64_t nbytes;
                    std::memcpy(&nbytes, pgd, sizeof(int64_t));
                    pgd += sizeof(int64_t);

                    for (int icomp = 0; icomp < ncomp; ++icomp) {
                        Real cmin, cmax;
                        std::memcpy(&cmin, pgd             , sizeof(Real));
                        std::memcpy(&cmax, pgd+sizeof(Real), sizeof(Real));
                        pgd += sizeof(Real)*2;
                        hdr->m_min[k][icomp] = cmin;
                        hdr->m_max[k][icomp] = cmax;
                        hdr->m_famin[icomp] = std::min(hdr->m_famin[icomp],cmin);
                        hdr->m_famax[icomp] = std::max(hdr->m_famax[icomp],cmax);
                    }

                    auto info = AsyncOut::GetWriteInfo(rank);
                    hdr->m_fod[k].m_name = amrex::Concatenate(VisMF::BaseName(mf_name)+FabFileSuffix,
                                                              info.ifile, 5);
                    hdr->m_fod[k].m_head = nbytes;
                }
            }

            Vector<int64_t> offset(nprocs);
            for (int ip = 0; ip < nprocs; ++ip) {
                auto info = AsyncOut::GetWriteInfo(ip);
                if (info.ispot == 0) {
                    offset[ip] = 0;
                } else {
                    offset[ip] = offset[ip-1] + nbytes_on_rank[ip-1];
                }
            }

            for (int k = 0; k < n_global_fabs; ++k) {
                hdr->m_fod[k].m_head += offset[dm[k]];
            }

            VisMF::WriteHeaderDoit(mf_name, *hdr);
        }

        VisMF::IO_Buffer io_buffer(ioBufferSize);

        AsyncOut::Wait();  // Wait for my turn

        auto info = AsyncOut::GetWriteInfo(myproc);
        if (! myfabs->empty()) {
            std::string file_name = amrex::Concatenate(mf_name + FabFileSuffix, info.ifile, 5);
            std::ofstream ofs;
            ofs.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            ofs.open(file_name.c_str(), (info.ispot == 0) ? (std::ios::binary | std::ios::trunc)
                                                          : (std::ios::binary | std::ios::app));
            if (!ofs.good()) amrex::FileOpenFailed(file_name);
            for (auto const& fab : *myfabs) {
                fabio->write_header(ofs, fab, fab.nComp());
                fabio->write(ofs, fab, 0, fab.nComp());
            }
            ofs.flush();
            ofs.close();
        }

        AsyncOut::Notify();  // Notify others I am done
    });
}